

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Unpack_external
              (char *datarep,void *inbuf,MPIABI_Aint insize,MPIABI_Aint *position,void *outbuf,
              int outcount,MPIABI_Datatype datatype)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  WPI_Handle<ompi_datatype_t_*> local_40;
  int local_34;
  void *pvStack_30;
  int outcount_local;
  void *outbuf_local;
  MPIABI_Aint *position_local;
  MPIABI_Aint insize_local;
  void *inbuf_local;
  char *datarep_local;
  
  local_34 = outcount;
  pvStack_30 = outbuf;
  outbuf_local = position;
  position_local = (MPIABI_Aint *)insize;
  insize_local = (MPIABI_Aint)inbuf;
  inbuf_local = datarep;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,datatype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  iVar1 = MPI_Unpack_external(datarep,inbuf,insize,position,outbuf,outcount,poVar2);
  return iVar1;
}

Assistant:

int MPIABI_Unpack_external(
  const char * datarep,
  const void * inbuf,
  MPIABI_Aint insize,
  MPIABI_Aint * position,
  void * outbuf,
  int outcount,
  MPIABI_Datatype datatype
) {
  return MPI_Unpack_external(
    datarep,
    inbuf,
    (MPI_Aint)(WPI_Aint)insize,
    (MPI_Aint *)(WPI_Aint *)position,
    outbuf,
    outcount,
    (MPI_Datatype)(WPI_Datatype)datatype
  );
}